

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# banner.cpp
# Opt level: O1

void OutputBanner(ofstream *ostream,Banner *banner)

{
  char cVar1;
  long lVar2;
  long lVar3;
  
  lVar3 = 0;
  do {
    cVar1 = (char)ostream;
    std::ostream::put(cVar1);
    lVar3 = lVar3 + 8;
  } while (lVar3 == 8);
  lVar3 = 0;
  do {
    std::ostream::put(cVar1);
    lVar3 = lVar3 + 8;
  } while (lVar3 == 8);
  lVar3 = 4;
  do {
    lVar2 = 1;
    do {
      std::ostream::put(cVar1);
      lVar2 = lVar2 + -1;
    } while (lVar2 == 0);
    lVar3 = lVar3 + 2;
  } while (lVar3 != 10);
  lVar3 = 0x16;
  do {
    std::ostream::put(cVar1);
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  lVar3 = 0;
  do {
    std::ostream::put(cVar1);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x200);
  lVar3 = 0;
  do {
    std::ostream::put(cVar1);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x20);
  lVar3 = 0x240;
  do {
    lVar2 = 0;
    do {
      std::ostream::put(cVar1);
      lVar2 = lVar2 + 8;
    } while (lVar2 == 8);
    lVar3 = lVar3 + 2;
  } while (lVar3 != 0x340);
  lVar3 = 0x340;
  do {
    lVar2 = 0;
    do {
      std::ostream::put(cVar1);
      lVar2 = lVar2 + 8;
    } while (lVar2 == 8);
    lVar3 = lVar3 + 2;
  } while (lVar3 != 0x440);
  lVar3 = 0x440;
  do {
    lVar2 = 0;
    do {
      std::ostream::put(cVar1);
      lVar2 = lVar2 + 8;
    } while (lVar2 == 8);
    lVar3 = lVar3 + 2;
  } while (lVar3 != 0x540);
  lVar3 = 0x540;
  do {
    lVar2 = 0;
    do {
      std::ostream::put(cVar1);
      lVar2 = lVar2 + 8;
    } while (lVar2 == 8);
    lVar3 = lVar3 + 2;
  } while (lVar3 != 0x640);
  lVar3 = 0x640;
  do {
    lVar2 = 0;
    do {
      std::ostream::put(cVar1);
      lVar2 = lVar2 + 8;
    } while (lVar2 == 8);
    lVar3 = lVar3 + 2;
  } while (lVar3 != 0x740);
  lVar3 = 0x740;
  do {
    lVar2 = 0;
    do {
      std::ostream::put(cVar1);
      lVar2 = lVar2 + 8;
    } while (lVar2 == 8);
    lVar3 = lVar3 + 2;
  } while (lVar3 != 0x840);
  return;
}

Assistant:

void OutputBanner(std::ofstream& ostream, const Banner& banner) {
    SerializeData<u16>(ostream, banner.version);
    SerializeData<u16>(ostream, banner.crc);

    for ([[maybe_unused]] u16 i : banner.crc_padding) {
        SerializeData<u16>(ostream, 0);
    }

    for ([[maybe_unused]] u8 i : banner.padding) {
        SerializeData<u8>(ostream, 0);
    }

    for (u8 i : banner.bitmap) {
        SerializeData<u8>(ostream, i);
    }

    for (u8 i : banner.palette) {
        SerializeData<u8>(ostream, i);
    }

    for (char16_t c : banner.japanese_title) {
        SerializeData<u16>(ostream, c);
    }

    for (char16_t c : banner.english_title) {
        SerializeData<u16>(ostream, c);
    }

    for (char16_t c : banner.french_title) {
        SerializeData<u16>(ostream, c);
    }

    for (char16_t c : banner.german_title) {
        SerializeData<u16>(ostream, c);
    }

    for (char16_t c : banner.italian_title) {
        SerializeData<u16>(ostream, c);
    }

    for (char16_t c : banner.spanish_title) {
        SerializeData<u16>(ostream, c);
    }
}